

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O1

int duckdb_lz4::LZ4_compress_generic
              (LZ4_stream_t_internal *cctx,char *src,char *dst,int srcSize,int *inputConsumed,
              int dstCapacity,limitedOutput_directive outputDirective,tableType_t tableType,
              dict_directive dictDirective,dictIssue_directive dictIssue,int acceleration)

{
  long lVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  LZ4_stream_t_internal *pLVar5;
  int *piVar6;
  short sVar7;
  bool bVar8;
  long lVar9;
  char cVar10;
  BYTE *d;
  LZ4_stream_t_internal *pLVar11;
  ulong uVar12;
  char *pcVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  long *pInLimit;
  long *plVar17;
  long *plVar18;
  ulong uVar19;
  long *plVar20;
  int iVar21;
  dict_directive dVar22;
  uint uVar23;
  long *plVar24;
  char cVar25;
  int iVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  char *pcVar30;
  U16 *hashTable;
  ulong uVar31;
  long *plVar32;
  long *local_f0;
  long *local_c8;
  int *local_c0;
  long local_a8;
  int *local_90;
  
  if (0x7e000000 < (uint)srcSize) {
    return 0;
  }
  if (srcSize == 0) {
    if (dstCapacity < 1 && outputDirective != notLimited) {
      return 0;
    }
    *dst = '\0';
    if (outputDirective != fillOutput) {
      return 1;
    }
    *inputConsumed = 0;
    return 1;
  }
  uVar3 = cctx->currentOffset;
  pLVar5 = cctx->dictCtx;
  iVar21 = 0;
  pLVar11 = cctx;
  if (dictDirective == usingDictCtx) {
    pLVar11 = pLVar5;
  }
  piVar6 = (int *)pLVar11->dictionary;
  uVar4 = pLVar11->dictSize;
  if (dictDirective == usingDictCtx) {
    iVar21 = uVar3 - pLVar5->currentOffset;
  }
  lVar1 = (long)piVar6 + (ulong)uVar4;
  if (piVar6 == (int *)0x0) {
    local_a8 = 0;
    lVar1 = 0;
  }
  else if (dictDirective == usingDictCtx) {
    local_a8 = lVar1 - (ulong)pLVar5->currentOffset;
  }
  else {
    local_a8 = lVar1 - (ulong)uVar3;
  }
  if (dstCapacity < 1 && outputDirective == fillOutput) {
    return 0;
  }
  if (0x1000a < srcSize && tableType == byU16) {
    return 0;
  }
  uVar19 = 0;
  if (dictDirective == withPrefix64k) {
    uVar19 = (ulong)uVar4;
  }
  if (dictDirective == usingDictCtx) {
    cctx->dictCtx = (LZ4_stream_t_internal *)0x0;
    cctx->dictSize = srcSize;
  }
  else {
    cctx->dictSize = cctx->dictSize + srcSize;
  }
  pcVar13 = dst + dstCapacity;
  cctx->currentOffset = uVar3 + srcSize;
  cctx->tableType = tableType;
  plVar17 = (long *)src;
  local_c8 = (long *)src;
  local_f0 = (long *)dst;
  if (0xc < srcSize) {
    if (tableType == byU16) {
      uVar14 = (uint)(*(int *)src * -0x61c8864f) >> 0x13;
    }
    else {
      uVar14 = (uint)((ulong)(*(long *)src * -0x30e4432345000000) >> 0x34);
    }
    if (tableType == byU16) {
      *(short *)((long)cctx->hashTable + (ulong)uVar14 * 2) = (short)uVar3;
    }
    else {
      cctx->hashTable[uVar14] = uVar3;
    }
    plVar17 = (long *)(src + 1);
    if (tableType == byU16) {
      uVar31 = (ulong)((uint)((int)*plVar17 * -0x61c8864f) >> 0x13);
    }
    else {
      uVar31 = (ulong)(*plVar17 * -0x30e4432345000000) >> 0x34;
    }
    lVar29 = (long)src - (ulong)uVar3;
    dVar22 = dictDirective & ~withPrefix64k;
    pInLimit = (long *)(src + ((ulong)(uint)srcSize - 5));
    local_c0 = (int *)(src + -uVar19);
    iVar27 = 0;
LAB_002e7471:
    iVar26 = 1;
    plVar20 = plVar17;
    iVar15 = acceleration << 6;
    do {
      if (tableType == byU32) {
        uVar14 = cctx->hashTable[uVar31];
      }
      else {
        uVar14 = (uint)*(ushort *)((long)cctx->hashTable + uVar31 * 2);
      }
      plVar17 = (long *)((long)iVar26 + (long)plVar20);
      if (src + ((ulong)(uint)srcSize - 0xb) < plVar17) {
        iVar26 = 2;
      }
      else {
        if (dictDirective == usingDictCtx) {
          if (uVar14 < uVar3) {
            uVar19 = (ulong)pLVar5->hashTable[uVar31];
            uVar14 = iVar21 + pLVar5->hashTable[uVar31];
LAB_002e74e5:
            local_90 = (int *)(uVar19 + local_a8);
            local_c0 = piVar6;
          }
          else {
LAB_002e74f8:
            local_90 = (int *)((ulong)uVar14 + lVar29);
            local_c0 = (int *)src;
          }
        }
        else {
          uVar19 = (ulong)uVar14;
          if (dictDirective == usingExtDict) {
            if (uVar3 <= uVar14) goto LAB_002e74f8;
            goto LAB_002e74e5;
          }
          local_90 = (int *)(uVar19 + lVar29);
        }
        if (tableType == byU16) {
          uVar19 = (ulong)((uint)((int)*plVar17 * -0x61c8864f) >> 0x13);
        }
        else {
          uVar19 = (ulong)(*plVar17 * -0x30e4432345000000) >> 0x34;
        }
        uVar16 = (uint)((long)plVar20 - lVar29);
        if (tableType == byU16) {
          *(short *)((long)cctx->hashTable + uVar31 * 2) = (short)((long)plVar20 - lVar29);
        }
        else {
          cctx->hashTable[uVar31] = uVar16;
        }
        iVar26 = 8;
        uVar31 = uVar19;
        if ((((dictIssue != dictSmall) || (uVar3 - uVar4 <= uVar14)) &&
            ((tableType == byU16 || (uVar16 <= uVar14 + 0xffff)))) &&
           (iVar26 = 0, *local_90 == (int)*plVar20)) {
          if (dVar22 == usingExtDict) {
            iVar27 = uVar16 - uVar14;
          }
          iVar26 = 7;
        }
      }
      if ((iVar26 != 0) && (iVar26 != 8)) goto LAB_002e75b6;
      iVar26 = iVar15 >> 6;
      iVar15 = iVar15 + 1;
      plVar20 = plVar17;
    } while( true );
  }
LAB_002e7d2b:
  iVar21 = (int)plVar17;
  pcVar30 = src + ((ulong)(uint)srcSize - (long)local_c8);
  if ((outputDirective != notLimited) &&
     (pcVar13 < (char *)((long)local_f0 + (long)(pcVar30 + (ulong)(pcVar30 + 0xf0) / 0xff + 1)))) {
    if (outputDirective != fillOutput) {
      bVar8 = false;
      goto LAB_002e7e47;
    }
    pcVar30 = pcVar13 + (~(ulong)local_f0 - ((ulong)(pcVar13 + ~(ulong)local_f0 + 0xf1) >> 8));
  }
  if (pcVar30 < (char *)0xf) {
    *(char *)local_f0 = (char)pcVar30 << 4;
  }
  else {
    pcVar13 = pcVar30 + -0xf;
    *(char *)local_f0 = -0x10;
    plVar17 = (long *)((long)local_f0 + 1);
    if ((char *)0xfe < pcVar13) {
      uVar19 = (ulong)(pcVar30 + -0x10e) / 0xff;
      memset(plVar17,0xff,uVar19 + 1);
      plVar17 = (long *)((long)local_f0 + uVar19 + 2);
      pcVar13 = pcVar30 + uVar19 * -0xff + -0x10e;
    }
    *(char *)plVar17 = (char)pcVar13;
    local_f0 = plVar17;
  }
  switchD_00337c71::default((char *)((long)local_f0 + 1),local_c8,(size_t)pcVar30);
  iVar21 = (int)local_c8 + (int)pcVar30;
  local_f0 = (long *)((long)local_f0 + (long)(pcVar30 + 1));
  bVar8 = true;
LAB_002e7e47:
  iVar27 = 0;
  if (bVar8) {
    if (outputDirective == fillOutput) {
      *inputConsumed = iVar21 - (int)src;
    }
    iVar27 = (int)local_f0 - (int)dst;
  }
  return iVar27;
LAB_002e75b6:
  if (iVar26 == 7) {
    iVar26 = 0;
  }
  plVar17 = plVar20;
  plVar32 = local_f0;
  if (iVar26 == 0) {
    uVar16 = (int)plVar20 - (int)local_c8;
    lVar9 = 0;
    uVar14 = uVar16 - 0xf;
    cVar10 = (char)plVar20 * '\x10' + (char)local_c8 * -0x10;
    do {
      cVar25 = cVar10;
      uVar23 = uVar14;
      lVar28 = lVar9;
      piVar2 = (int *)((long)local_90 + lVar28);
      plVar17 = (long *)(lVar28 + (long)plVar20);
      if ((piVar2 <= local_c0) || (plVar17 <= local_c8)) break;
      lVar9 = lVar28 + -1;
      uVar14 = uVar23 - 1;
      cVar10 = cVar25 + -0x10;
    } while (*(char *)((long)plVar20 + lVar28 + -1) == *(char *)((long)local_90 + lVar28 + -1));
    uVar19 = (long)plVar17 - (long)local_c8;
    plVar18 = (long *)((long)local_f0 + 1);
    if ((outputDirective == limitedOutput) &&
       (pcVar13 < (char *)((long)plVar18 +
                          ((ulong)uVar16 + lVar28 & 0xffffffff) / 0xff + (uVar19 & 0xffffffff) + 8))
       ) {
      iVar26 = 1;
      bVar8 = false;
    }
    else {
      iVar15 = (int)lVar28;
      if ((outputDirective == fillOutput) &&
         (pcVar13 < (char *)((long)plVar18 +
                            (uVar19 & 0xffffffff) + (ulong)(uVar16 + iVar15 + 0xf0) / 0xff + 0xb)))
      {
        iVar26 = 2;
        bVar8 = false;
        plVar18 = local_f0;
      }
      else {
        if ((uint)((ulong)uVar16 + lVar28) < 0xf) {
          *(char *)local_f0 = cVar25;
        }
        else {
          uVar12 = (ulong)(uVar16 - 0xf) + lVar28;
          *(char *)local_f0 = -0x10;
          if (0xfe < (int)uVar12) {
            if (0x1fc < (int)uVar23) {
              uVar23 = 0x1fd;
            }
            uVar14 = (uVar16 - uVar23) + iVar15 + 0xef;
            memset(plVar18,0xff,(ulong)(uVar14 / 0xff + 1));
            plVar18 = (long *)((long)local_f0 + (ulong)uVar14 / 0xff + 2);
            uVar12 = (ulong)((uVar16 - 0x10e) + iVar15 + uVar14 / 0xff);
          }
          *(char *)plVar18 = (char)uVar12;
          plVar18 = (long *)((long)plVar18 + 1);
        }
        plVar24 = (long *)((uVar19 & 0xffffffff) + (long)plVar18);
        plVar32 = local_c8;
        do {
          *plVar18 = *plVar32;
          plVar18 = plVar18 + 1;
          plVar32 = plVar32 + 1;
        } while (plVar18 < plVar24);
        iVar26 = 0;
        bVar8 = true;
        plVar18 = plVar24;
      }
    }
    plVar32 = plVar18;
    local_90 = piVar2;
    if (bVar8) {
      iVar26 = 2;
      plVar24 = local_c8;
      do {
        if ((outputDirective == fillOutput) &&
           (plVar32 = local_f0, local_c8 = plVar24, pcVar13 < (char *)((long)plVar18 + 0xb)))
        goto LAB_002e780b;
        sVar7 = (short)plVar17 - (short)local_90;
        if (dVar22 == usingExtDict) {
          sVar7 = (short)iVar27;
        }
        *(short *)plVar18 = sVar7;
        if ((dVar22 != usingExtDict) || (local_c0 != piVar6)) {
          uVar14 = LZ4_count((BYTE *)((long)plVar17 + 4),(BYTE *)(local_90 + 1),(BYTE *)pInLimit);
          local_c8 = (long *)((long)plVar17 + (ulong)uVar14 + 4);
        }
        else {
          plVar32 = (long *)((lVar1 - (long)local_90) + (long)plVar17);
          if (pInLimit < plVar32) {
            plVar32 = pInLimit;
          }
          uVar14 = LZ4_count((BYTE *)((long)plVar17 + 4),(BYTE *)(local_90 + 1),(BYTE *)plVar32);
          local_c8 = (long *)((long)plVar17 + (ulong)uVar14 + 4);
          if (local_c8 == plVar32) {
            uVar16 = LZ4_count((BYTE *)plVar32,(BYTE *)src,(BYTE *)pInLimit);
            uVar14 = uVar14 + uVar16;
            local_c8 = (long *)((long)local_c8 + (ulong)uVar16);
          }
        }
        plVar32 = (long *)((long)plVar18 + 2);
        uVar16 = uVar14;
        if ((outputDirective == notLimited) ||
           ((char *)((long)plVar18 + (ulong)(uVar14 + 0xf0) / 0xff + 8) <= pcVar13)) {
LAB_002e79c9:
          if (uVar16 < 0xf) {
            *(char *)local_f0 = (char)*local_f0 + (char)uVar16;
          }
          else {
            *(char *)local_f0 = (char)*local_f0 + '\x0f';
            uVar14 = uVar16 - 0xf;
            *(undefined4 *)plVar32 = 0xffffffff;
            if (0x3fb < uVar14) {
              uVar16 = uVar16 - 0x40b;
              memset((char *)((long)plVar18 + 6),0xff,(ulong)((uVar16 / 0x3fc) * 4 + 4));
              uVar14 = uVar16 % 0x3fc;
              plVar32 = (long *)((long)plVar18 + (ulong)((uVar16 / 0x3fc) * 4) + 6);
            }
            pcVar30 = (char *)((long)plVar32 + (ulong)uVar14 / 0xff);
            plVar32 = (long *)(pcVar30 + 1);
            *pcVar30 = (char)((ulong)uVar14 * 0x8080808081 >> 0x27);
          }
          bVar8 = true;
        }
        else {
          if (outputDirective == fillOutput) {
            uVar16 = ((int)pcVar13 - (int)plVar32) * 0xff - 0x5ec;
            local_c8 = (long *)((long)local_c8 - (ulong)(uVar14 - uVar16));
            if (local_c8 <= plVar20) {
              LZ4_compress_generic();
            }
            goto LAB_002e79c9;
          }
          bVar8 = false;
        }
        plVar17 = local_c8;
        if (!bVar8) {
          iVar26 = 1;
          local_c8 = plVar24;
          goto LAB_002e780b;
        }
        if (src + ((ulong)(uint)srcSize - 0xb) <= local_c8) {
          iVar26 = 3;
          goto LAB_002e780b;
        }
        plVar18 = (long *)((long)local_c8 + -2);
        if (tableType == byU16) {
          uVar14 = (uint)(*(int *)plVar18 * -0x61c8864f) >> 0x13;
        }
        else {
          uVar14 = (uint)((ulong)(*plVar18 * -0x30e4432345000000) >> 0x34);
        }
        if (tableType == byU16) {
          *(short *)((long)cctx->hashTable + (ulong)uVar14 * 2) = (short)((long)plVar18 - lVar29);
          uVar14 = (uint)((int)*local_c8 * -0x61c8864f) >> 0x13;
        }
        else {
          cctx->hashTable[uVar14] = (LZ4_u32)((long)plVar18 - lVar29);
          uVar14 = (uint)((ulong)(*local_c8 * -0x30e4432345000000) >> 0x34);
        }
        uVar19 = (ulong)uVar14;
        if (tableType == byU32) {
          uVar14 = cctx->hashTable[uVar19];
        }
        else {
          uVar14 = (uint)*(ushort *)((long)cctx->hashTable + uVar19 * 2);
        }
        if (dictDirective == usingDictCtx) {
          if (uVar14 < uVar3) {
            uVar12 = (ulong)pLVar5->hashTable[uVar19];
            uVar14 = iVar21 + pLVar5->hashTable[uVar19];
LAB_002e7b73:
            local_90 = (int *)(uVar12 + local_a8);
            local_c0 = piVar6;
          }
          else {
LAB_002e7b87:
            local_90 = (int *)((ulong)uVar14 + lVar29);
            local_c0 = (int *)src;
          }
        }
        else {
          uVar12 = (ulong)uVar14;
          if (dictDirective == usingExtDict) {
            if (uVar3 <= uVar14) goto LAB_002e7b87;
            goto LAB_002e7b73;
          }
          local_90 = (int *)(uVar12 + lVar29);
        }
        uVar16 = (uint)((long)local_c8 - lVar29);
        if (tableType == byU16) {
          *(short *)((long)cctx->hashTable + uVar19 * 2) = (short)((long)local_c8 - lVar29);
        }
        else {
          cctx->hashTable[uVar19] = uVar16;
        }
        bVar8 = true;
        plVar18 = plVar32;
        if ((((dictIssue != dictSmall) || (uVar3 - uVar4 <= uVar14)) &&
            ((tableType == byU16 || (uVar16 <= uVar14 + 0xffff)))) && (*local_90 == (int)*local_c8))
        {
          *(char *)plVar32 = '\0';
          if (dVar22 == usingExtDict) {
            iVar27 = uVar16 - uVar14;
          }
          bVar8 = false;
          plVar18 = (long *)((long)plVar32 + 1);
          local_f0 = plVar32;
        }
        plVar24 = local_c8;
      } while (!bVar8);
      plVar17 = (long *)((long)local_c8 + 1);
      if (tableType == byU16) {
        uVar31 = (ulong)((uint)(*(int *)plVar17 * -0x61c8864f) >> 0x13);
      }
      else {
        uVar31 = (ulong)(*plVar17 * -0x30e4432345000000) >> 0x34;
      }
      iVar26 = 0;
      plVar32 = plVar18;
    }
  }
LAB_002e780b:
  local_f0 = plVar32;
  if (iVar26 != 0) goto LAB_002e7cff;
  goto LAB_002e7471;
LAB_002e7cff:
  if (1 < iVar26 - 2U) {
    return 0;
  }
  goto LAB_002e7d2b;
}

Assistant:

LZ4_FORCE_INLINE int LZ4_compress_generic(
                 LZ4_stream_t_internal* const cctx,
                 const char* const src,
                 char* const dst,
                 const int srcSize,
                 int *inputConsumed, /* only written when outputDirective == fillOutput */
                 const int dstCapacity,
                 const limitedOutput_directive outputDirective,
                 const tableType_t tableType,
                 const dict_directive dictDirective,
                 const dictIssue_directive dictIssue,
                 const int acceleration)
{
    DEBUGLOG(5, "LZ4_compress_generic: srcSize=%i, dstCapacity=%i",
                srcSize, dstCapacity);

    if ((U32)srcSize > (U32)LZ4_MAX_INPUT_SIZE) { return 0; }  /* Unsupported srcSize, too large (or negative) */
    if (srcSize == 0) {   /* src == NULL supported if srcSize == 0 */
        if (outputDirective != notLimited && dstCapacity <= 0) return 0;  /* no output, can't write anything */
        DEBUGLOG(5, "Generating an empty block");
        assert(outputDirective == notLimited || dstCapacity >= 1);
        assert(dst != NULL);
        dst[0] = 0;
        if (outputDirective == fillOutput) {
            assert (inputConsumed != NULL);
            *inputConsumed = 0;
        }
        return 1;
    }
    assert(src != NULL);

    return LZ4_compress_generic_validated(cctx, src, dst, srcSize,
                inputConsumed, /* only written into if outputDirective == fillOutput */
                dstCapacity, outputDirective,
                tableType, dictDirective, dictIssue, acceleration);
}